

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  timediff_t tVar7;
  ulong uVar8;
  Curl_tree *pCVar9;
  Curl_tree *pCVar10;
  Curl_tree *pCVar11;
  Curl_tree *pCVar12;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  Curl_tree N;
  Curl_tree local_68;
  
  uVar8 = i._8_8_;
  newer.tv_sec = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    return (Curl_tree *)0x0;
  }
  pCVar9 = &local_68;
  local_68.smaller = (Curl_tree *)0x0;
  local_68.larger = (Curl_tree *)0x0;
  pCVar10 = &local_68;
  do {
    uVar1 = (t->key).tv_sec;
    uVar2 = (t->key).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._8_8_ = uVar8 & 0xffffffff;
    older._12_4_ = 0;
    tVar7 = Curl_timediff_us(newer,older);
    if (tVar7 < 0) {
      pCVar11 = t->smaller;
      if (pCVar11 == (Curl_tree *)0x0) {
LAB_00156035:
        pCVar9->larger = t->smaller;
        pCVar10->smaller = t->larger;
        t->smaller = local_68.larger;
        t->larger = local_68.smaller;
        return t;
      }
      uVar5 = (pCVar11->key).tv_sec;
      uVar6 = (pCVar11->key).tv_usec;
      older_01.tv_usec = uVar6;
      older_01.tv_sec = uVar5;
      newer_01._8_8_ = uVar8 & 0xffffffff;
      newer_01.tv_sec = newer.tv_sec;
      older_01._12_4_ = 0;
      tVar7 = Curl_timediff_us(newer_01,older_01);
      pCVar11 = t;
      if (tVar7 < 0) {
        pCVar11 = t->smaller;
        t->smaller = pCVar11->larger;
        pCVar11->larger = t;
        t = pCVar11;
        if (pCVar11->smaller == (Curl_tree *)0x0) goto LAB_00156035;
      }
      pCVar10->smaller = pCVar11;
      pCVar10 = pCVar11;
    }
    else {
      if ((tVar7 == 0) || (pCVar11 = t->larger, pCVar11 == (Curl_tree *)0x0)) goto LAB_00156035;
      uVar3 = (pCVar11->key).tv_sec;
      uVar4 = (pCVar11->key).tv_usec;
      older_00.tv_usec = uVar4;
      older_00.tv_sec = uVar3;
      newer_00._8_8_ = uVar8 & 0xffffffff;
      newer_00.tv_sec = newer.tv_sec;
      older_00._12_4_ = 0;
      tVar7 = Curl_timediff_us(newer_00,older_00);
      pCVar12 = t;
      if (0 < tVar7) {
        pCVar12 = t->larger;
        t->larger = pCVar12->smaller;
        pCVar12->smaller = t;
        t = pCVar12;
        if (pCVar12->larger == (Curl_tree *)0x0) goto LAB_00156035;
      }
      pCVar9->larger = pCVar12;
      pCVar9 = pCVar12;
      pCVar11 = pCVar10;
      pCVar10 = (Curl_tree *)&pCVar12->larger;
    }
    t = pCVar10->smaller;
    pCVar10 = pCVar11;
  } while( true );
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;

  if(!t)
    return NULL;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    timediff_t comp = compare(i, t->key);
    if(comp < 0) {
      if(!t->smaller)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(!t->smaller)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(!t->larger)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(!t->larger)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}